

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O0

void __thiscall
serialize_tests::Base::Serialize<ParamsStream<DataStream&,serialize_tests::BaseFormat>>
          (Base *this,ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *s)

{
  BaseFormat *pBVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> in_stack_00000000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  Span<const_unsigned_char> *in_stack_ffffffffffffff88;
  Span<const_char> *this_00;
  Span<const_char> local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar1 = ParamsStream<DataStream_&,_serialize_tests::BaseFormat>::
           GetParams<serialize_tests::BaseFormat>
                     ((ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *)
                      in_stack_ffffffffffffff78);
  if (pBVar1->m_base_format == RAW) {
    ParamsStream<DataStream&,serialize_tests::BaseFormat>::operator<<
              ((ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *)in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
  }
  else {
    Span<const_unsigned_char>::Span<const_unsigned_char,_0>
              (in_stack_ffffffffffffff88,(uchar *)in_RSI,(size_t)in_stack_ffffffffffffff78);
    this_00 = local_28;
    HexStr_abi_cxx11_(in_stack_00000000);
    Span<char_const>::Span<std::__cxx11::string>(this_00,in_RSI,in_stack_ffffffffffffff78);
    ParamsStream<DataStream&,serialize_tests::BaseFormat>::operator<<
              ((ParamsStream<DataStream_&,_serialize_tests::BaseFormat> *)this_00,
               (Span<const_char> *)in_RSI);
    std::__cxx11::string::~string(in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& s) const
    {
        if (s.template GetParams<BaseFormat>().m_base_format == BaseFormat::RAW) {
            s << m_base_data;
        } else {
            s << Span{HexStr(Span{&m_base_data, 1})};
        }
    }